

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

void __thiscall
BssSectionImport_MissingSize_Test::~BssSectionImport_MissingSize_Test
          (BssSectionImport_MissingSize_Test *this)

{
  (this->super_BssSectionImport).super_Test._vptr_Test =
       (_func_int **)&PTR__BssSectionImport_0023b170;
  pstore::database::~database(&(this->super_BssSectionImport).db_);
  in_memory_store::~in_memory_store(&(this->super_BssSectionImport).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (BssSectionImport, MissingSize) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data value is missing.
    auto const & parser = parse<pstore::repo::section_kind::bss> (
        R"({ "align":8 })", &db_, pstore::exchange::import_ns::string_mapping{}, &inserter,
        &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bss_section_was_incomplete));
}